

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

float __thiscall cnn::Model::gradient_l2_norm(Model *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  undefined8 uVar5;
  ulong uVar6;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *__range1;
  uint uVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  
  if (*(long *)(this + 0x48) == 0) {
    uVar5 = (**(code **)(**(long **)(default_device + 0x10) + 0x10))
                      (*(long **)(default_device + 0x10),*(long *)(this + 8) - *(long *)this >> 1);
    *(undefined8 *)(this + 0x48) = uVar5;
  }
  lVar2 = *(long *)this;
  lVar3 = *(long *)(this + 8);
  dVar10 = 0.0;
  if (lVar2 != lVar3) {
    lVar8 = 0;
    lVar9 = 0;
    uVar7 = 0;
    do {
      plVar4 = *(long **)(lVar2 + lVar9 * 2);
      (**(code **)(*plVar4 + 0x10))(plVar4,*(long *)(this + 0x48) + lVar9);
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 4;
      lVar1 = lVar2 + lVar8;
      lVar8 = lVar8 + 8;
    } while (lVar1 + 8 != lVar3);
    dVar10 = 0.0;
    uVar6 = 0;
    do {
      dVar10 = dVar10 + (double)*(float *)(*(long *)(this + 0x48) + uVar6 * 4);
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  return (float)dVar10;
}

Assistant:

float Model::gradient_l2_norm() const {
  if (!gradient_norm_scratch)
    gradient_norm_scratch = (float*)default_device->mem->malloc(all_params.size() * sizeof(float));
  int pi = 0;
  for (auto p : all_params) {
    p->g_squared_l2norm(&gradient_norm_scratch[pi]);
    ++pi;
  }
#if HAVE_CUDA
  float res = 0;
  gpu::l2_norm_reducer(all_params.size(), gradient_norm_scratch, gradient_norm_scratch, false, false);
  cudaMemcpy(&res, gradient_norm_scratch, sizeof(float),  cudaMemcpyDeviceToHost);
  return sqrt(res);
#else
  double gg = 0;
  for (int i = 0; i < pi; ++i)
    gg += gradient_norm_scratch[i];
  return sqrt(gg);
#endif
}